

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3NestedParse(Parse *pParse,char *zFormat,...)

{
  Token *__src;
  u32 uVar1;
  sqlite3 *db;
  char in_AL;
  char *zSql;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char saveBuf [136];
  __va_list_tag local_188;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined1 local_b8 [136];
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  if (pParse->nErr == 0) {
    db = pParse->db;
    uVar1 = db->mDbFlags;
    local_188.reg_save_area = local_168;
    local_188.overflow_arg_area = &ap[0].overflow_arg_area;
    local_188.gp_offset = 0x10;
    local_188.fp_offset = 0x30;
    local_158 = in_RDX;
    local_150 = in_RCX;
    local_148 = in_R8;
    local_140 = in_R9;
    zSql = sqlite3VMPrintf(db,zFormat,&local_188);
    if (zSql == (char *)0x0) {
      if (db->mallocFailed == '\0') {
        pParse->rc = 0x12;
      }
      pParse->nErr = pParse->nErr + 1;
    }
    else {
      pParse->nested = pParse->nested + '\x01';
      __src = &pParse->sLastToken;
      memcpy(local_b8,__src,0x88);
      memset(__src,0,0x88);
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 2;
      sqlite3RunParser(pParse,zSql);
      db->mDbFlags = uVar1;
      sqlite3DbFreeNN(db,zSql);
      memcpy(__src,local_b8,0x88);
      pParse->nested = pParse->nested + 0xff;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3NestedParse(Parse *pParse, const char *zFormat, ...){
  va_list ap;
  char *zSql;
  sqlite3 *db = pParse->db;
  u32 savedDbFlags = db->mDbFlags;
  char saveBuf[PARSE_TAIL_SZ];

  if( pParse->nErr ) return;
  assert( pParse->nested<10 );  /* Nesting should only be of limited depth */
  va_start(ap, zFormat);
  zSql = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    /* This can result either from an OOM or because the formatted string
    ** exceeds SQLITE_LIMIT_LENGTH.  In the latter case, we need to set
    ** an error */
    if( !db->mallocFailed ) pParse->rc = SQLITE_TOOBIG;
    pParse->nErr++;
    return;
  }
  pParse->nested++;
  memcpy(saveBuf, PARSE_TAIL(pParse), PARSE_TAIL_SZ);
  memset(PARSE_TAIL(pParse), 0, PARSE_TAIL_SZ);
  db->mDbFlags |= DBFLAG_PreferBuiltin;
  sqlite3RunParser(pParse, zSql);
  db->mDbFlags = savedDbFlags;
  sqlite3DbFree(db, zSql);
  memcpy(PARSE_TAIL(pParse), saveBuf, PARSE_TAIL_SZ);
  pParse->nested--;
}